

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrGroup.c
# Opt level: O3

MtrNode * Mtr_InitGroupTree(int lower,int size)

{
  MtrNode *pMVar1;
  
  pMVar1 = Mtr_InitTree();
  if (pMVar1 != (MtrNode *)0x0) {
    pMVar1->flags = 0;
    pMVar1->low = lower;
    pMVar1->size = size;
  }
  return pMVar1;
}

Assistant:

MtrNode *
Mtr_InitGroupTree(
  int  lower,
  int  size)
{
    MtrNode *root;

    root = Mtr_InitTree();
    if (root == NULL) return(NULL);
    root->flags = MTR_DEFAULT;
    root->low = lower;
    root->size = size;
    return(root);

}